

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int oog_encode(double u,double v)

{
  float fVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  uint uVar10;
  int iVar11;
  double *pdVar12;
  int iVar13;
  ulong uVar14;
  undefined1 *puVar15;
  bool bVar16;
  double dVar17;
  double eps [100];
  double adStack_358 [100];
  undefined1 local_38 [8];
  
  if (oog_encode_initialized == '\0') {
    lVar4 = 99;
    do {
      adStack_358[lVar4] = 2.0;
      bVar16 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar16);
    lVar4 = 0xa2;
    do {
      sVar2 = uv_row[lVar4].nus;
      iVar11 = sVar2 + -1;
      iVar13 = iVar11;
      if (sVar2 < 2) {
        iVar13 = 1;
      }
      if (lVar4 == 0) {
        iVar13 = 1;
      }
      if (lVar4 == 0xa2) {
        iVar13 = 1;
      }
      if (0 < sVar2) {
        fVar1 = uv_row[lVar4].ustart;
        do {
          dVar17 = atan2(((double)(int)lVar4 + 0.5) * 0.0035000001080334187 + 0.016939999535679817 +
                         -0.473684211,
                         ((double)iVar11 + 0.5) * 0.0035000001080334187 + (double)fVar1 +
                         -0.210526316);
          dVar17 = dVar17 * 15.915494277358546 + 50.0;
          iVar3 = (int)dVar17;
          dVar17 = ABS(dVar17 - ((double)(int)dVar17 + 0.5));
          if (dVar17 < adStack_358[iVar3]) {
            oog_encode::oog_table[iVar3] = uv_row[lVar4].ncum + iVar11;
            adStack_358[iVar3] = dVar17;
          }
          iVar11 = iVar11 - iVar13;
        } while (-1 < iVar11);
      }
      bVar16 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar16);
    puVar5 = local_38;
    lVar4 = 99;
    uVar7 = 100;
    uVar8 = 0xc6;
    pdVar9 = eps + 0x57;
    do {
      if (1.5 < adStack_358[lVar4]) {
        uVar10 = 1;
        uVar14 = uVar7;
        puVar15 = puVar5;
        do {
          if (*(double *)(puVar15 + (uVar14 / 100) * -800) <= 1.5 &&
              *(double *)(puVar15 + (uVar14 / 100) * -800) != 1.5) goto LAB_002aaf77;
          uVar10 = uVar10 + 1;
          puVar15 = puVar15 + 8;
          uVar14 = uVar14 + 1;
        } while (uVar10 != 0x32);
        uVar10 = 0x32;
LAB_002aaf77:
        uVar6 = 1;
        iVar11 = -1;
        pdVar12 = pdVar9;
        uVar14 = uVar8;
        do {
          if (pdVar12[(uVar14 / 100) * -100] <= 1.5 && pdVar12[(uVar14 / 100) * -100] != 1.5)
          goto LAB_002aafc2;
          uVar6 = uVar6 + 1;
          pdVar12 = pdVar12 + -1;
          uVar14 = uVar14 - 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != -0x32);
        iVar11 = -0x32;
        uVar6 = 0x32;
LAB_002aafc2:
        iVar11 = (int)uVar7 + 99 + iVar11;
        if (uVar10 < uVar6) {
          iVar11 = uVar10 + (int)lVar4;
        }
        oog_encode::oog_table[lVar4] = oog_encode::oog_table[iVar11 % 100];
      }
      uVar7 = uVar7 - 1;
      puVar5 = puVar5 + -8;
      pdVar9 = pdVar9 + -1;
      uVar8 = uVar8 - 1;
      bVar16 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar16);
    oog_encode_initialized = '\x01';
  }
  dVar17 = atan2(v + -0.473684211,u + -0.210526316);
  return oog_encode::oog_table[(int)(dVar17 * 15.915494277358546 + 50.0)];
}

Assistant:

static int oog_encode(double u, double v) /* encode out-of-gamut chroma */
{
    static int oog_table[NANGLES];
    static int initialized = 0;
    register int i;

    if (!initialized)
    { /* set up perimeter table */
        double eps[NANGLES], ua, va, ang, epsa;
        int ui, vi, ustep;
        for (i = NANGLES; i--;)
            eps[i] = 2.;
        for (vi = UV_NVS; vi--;)
        {
            va = UV_VSTART + (vi + .5) * UV_SQSIZ;
            ustep = uv_row[vi].nus - 1;
            if (vi == UV_NVS - 1 || vi == 0 || ustep <= 0)
                ustep = 1;
            for (ui = uv_row[vi].nus - 1; ui >= 0; ui -= ustep)
            {
                ua = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
                ang = uv2ang(ua, va);
                i = (int)ang;
                epsa = fabs(ang - (i + .5));
                if (epsa < eps[i])
                {
                    oog_table[i] = uv_row[vi].ncum + ui;
                    eps[i] = epsa;
                }
            }
        }
        for (i = NANGLES; i--;) /* fill any holes */
            if (eps[i] > 1.5)
            {
                int i1, i2;
                for (i1 = 1; i1 < NANGLES / 2; i1++)
                    if (eps[(i + i1) % NANGLES] < 1.5)
                        break;
                for (i2 = 1; i2 < NANGLES / 2; i2++)
                    if (eps[(i + NANGLES - i2) % NANGLES] < 1.5)
                        break;
                if (i1 < i2)
                    oog_table[i] = oog_table[(i + i1) % NANGLES];
                else
                    oog_table[i] = oog_table[(i + NANGLES - i2) % NANGLES];
            }
        initialized = 1;
    }
    i = (int)uv2ang(u, v); /* look up hue angle */
    return (oog_table[i]);
}